

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initializer.cpp
# Opt level: O0

void Am_Initializer::Do_Cleanup(void)

{
  bool bVar1;
  reference ppAVar2;
  reference ppAVar3;
  _Self local_28;
  _Self local_20;
  iterator it;
  reverse_iterator reverseIt;
  
  std::__cxx11::list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>::rbegin
            ((list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_> *)&stack0xfffffffffffffff0);
  while( true ) {
    std::__cxx11::list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>::rend
              ((list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_> *)&it);
    bVar1 = std::operator!=((reverse_iterator<std::_List_iterator<Am_Initializer_*>_> *)
                            &stack0xfffffffffffffff0,
                            (reverse_iterator<std::_List_iterator<Am_Initializer_*>_> *)&it);
    if (!bVar1) break;
    ppAVar2 = std::reverse_iterator<std::_List_iterator<Am_Initializer_*>_>::operator*
                        ((reverse_iterator<std::_List_iterator<Am_Initializer_*>_> *)
                         &stack0xfffffffffffffff0);
    if ((*ppAVar2)->cleanup != (Am_Initializer_Procedure *)0x0) {
      ppAVar2 = std::reverse_iterator<std::_List_iterator<Am_Initializer_*>_>::operator*
                          ((reverse_iterator<std::_List_iterator<Am_Initializer_*>_> *)
                           &stack0xfffffffffffffff0);
      (*(*ppAVar2)->cleanup)();
    }
    std::reverse_iterator<std::_List_iterator<Am_Initializer_*>_>::operator++
              ((reverse_iterator<std::_List_iterator<Am_Initializer_*>_> *)&stack0xfffffffffffffff0)
    ;
  }
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>::begin
                 (am_initializer_list_abi_cxx11_);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>::end
                   (am_initializer_list_abi_cxx11_);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppAVar3 = std::_List_iterator<Am_Initializer_*>::operator*(&local_20);
    if (*ppAVar3 != (Am_Initializer *)0x0) {
      operator_delete(*ppAVar3);
    }
    std::_List_iterator<Am_Initializer_*>::operator++(&local_20);
  }
  return;
}

Assistant:

void
Am_Initializer::Do_Cleanup()
{
  for (INITIALIZERLIST::reverse_iterator reverseIt =
           am_initializer_list->rbegin();
       reverseIt != am_initializer_list->rend(); ++reverseIt) {
    // check if we have a function to call
    if ((*reverseIt)->cleanup != static_cast<Am_Initializer_Procedure *>(nullptr)) {
// call the cleanup() function stored in the Am_Initializer object
#ifdef LEAK_TRACE
      DERR("Cleaningup: " << (*reverseIt)->name << "\t\tPriority: "
                          << (*reverseIt)->priority << std::endl);
#endif
      (*reverseIt)->cleanup();
    }
  }

  // iterate through the list if Am_Initializer objects and free them
  for (INITIALIZERLIST::iterator it = am_initializer_list->begin();
       it != am_initializer_list->end(); ++it) {
    delete (*it);
  }
}